

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_long,long>::
Flush<duckdb::BitpackingCompressionState<unsigned_long,true,long>::BitpackingWriter>
          (BitpackingState<unsigned_long,long> *this)

{
  unsigned_long *puVar1;
  unsigned_long *values;
  BitpackingState<unsigned_long,long> BVar2;
  byte width;
  uint64_t right;
  unsigned_long uVar3;
  long lVar4;
  unsigned_long value_1;
  ulong uVar5;
  uint64_t left;
  byte bVar6;
  ulong uVar7;
  
  uVar7 = 1;
  if (*(idx_t *)(this + 0x8810) == 0) goto LAB_0107c0b2;
  if (this[0x8861] == (BitpackingState<unsigned_long,long>)0x0) {
    right = *(uint64_t *)(this + 0x8828);
    left = *(uint64_t *)(this + 0x8830);
    if (left == right) goto LAB_0107be08;
  }
  else {
LAB_0107be08:
    left = *(uint64_t *)(this + 0x8830);
    if ((byte)((char)this[0x8864] - 1U) < 2) {
      BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteConstant
                (left,*(idx_t *)(this + 0x8810),*(void **)(this + 0x8820),(bool)this[0x8861]);
      *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0xc;
      goto LAB_0107c0b2;
    }
    right = *(uint64_t *)(this + 0x8828);
  }
  BVar2 = (BitpackingState<unsigned_long,long>)
          TrySubtractOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (left,right,(uint64_t *)(this + 0x8838));
  this[0x8863] = BVar2;
  BitpackingState<unsigned_long,_long>::CalculateDeltaStats
            ((BitpackingState<unsigned_long,_long> *)this);
  if (this[0x8862] == (BitpackingState<unsigned_long,long>)0x1) {
    uVar3 = *(unsigned_long *)(this + 0x8840);
    if (((byte)this[0x8864] & 0xfe) != 4 && *(unsigned_long *)(this + 0x8848) == uVar3) {
      BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteConstantDelta
                (*(unsigned_long *)(this + 0x8848),**(unsigned_long **)(this + 0x4008),
                 *(idx_t *)(this + 0x8810),*(unsigned_long **)(this + 0x4008),
                 (bool *)(this + 0x8010),*(void **)(this + 0x8820));
      *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x14;
      goto LAB_0107c0b2;
    }
    uVar7 = *(ulong *)(this + 0x8838);
    uVar5 = *(ulong *)(this + 0x8850);
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    bVar6 = 0x40 - ((byte)lVar4 ^ 0x3f);
    if (uVar5 >> 0x38 != 0) {
      bVar6 = 0x40;
    }
    width = 0;
    if (uVar5 != 0) {
      width = bVar6;
    }
    lVar4 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    bVar6 = 0x40 - ((byte)lVar4 ^ 0x3f);
    if (uVar7 >> 0x38 != 0) {
      bVar6 = 0x40;
    }
    if ((this[0x8864] == (BitpackingState<unsigned_long,long>)0x5 || uVar7 == 0) || bVar6 <= width)
    goto LAB_0107bf0c;
    if (*(long *)(this + 0x8810) == 0) {
      uVar7 = 0;
    }
    else {
      uVar5 = 0;
      do {
        *(unsigned_long *)(this + uVar5 * 8 + 0x4010) = *(long *)(this + uVar5 * 8 + 0x4010) - uVar3
        ;
        uVar5 = uVar5 + 1;
        uVar7 = *(ulong *)(this + 0x8810);
      } while (uVar5 < uVar7);
      uVar3 = *(unsigned_long *)(this + 0x8840);
    }
    BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteDeltaFor
              ((unsigned_long *)(this + 0x4010),(bool *)(this + 0x8010),width,uVar3,
               *(long *)(this + 0x8858),*(unsigned_long **)(this + 0x4008),uVar7,
               *(void **)(this + 0x8820));
    uVar7 = *(ulong *)(this + 0x8810);
    lVar4 = *(long *)(this + 0x8818) + 0x18;
    *(long *)(this + 0x8818) = lVar4;
    if ((uVar7 & 0x1f) != 0) {
      uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar7 & 0x1f);
      uVar7 = (uVar7 - uVar3) + 0x20;
      lVar4 = *(long *)(this + 0x8818);
    }
    *(ulong *)(this + 0x8818) = (width * uVar7 >> 3) + lVar4;
  }
  else {
LAB_0107bf0c:
    uVar7 = 0;
    if (this[0x8863] != (BitpackingState<unsigned_long,long>)0x1) goto LAB_0107c0b2;
    uVar5 = *(ulong *)(this + 0x8838);
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    bVar6 = 0x40;
    if (uVar5 >> 0x38 == 0) {
      bVar6 = 0x40 - ((byte)lVar4 ^ 0x3f);
    }
    if (uVar5 == 0) {
      bVar6 = 0;
    }
    values = *(unsigned_long **)(this + 0x4008);
    uVar3 = *(unsigned_long *)(this + 0x8828);
    if (*(long *)(this + 0x8810) != 0) {
      uVar5 = 0;
      do {
        puVar1 = values + uVar5;
        *puVar1 = *puVar1 - uVar3;
        uVar5 = uVar5 + 1;
        uVar7 = *(ulong *)(this + 0x8810);
      } while (uVar5 < uVar7);
      uVar3 = *(unsigned_long *)(this + 0x8828);
    }
    BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteFor
              (values,(bool *)(this + 0x8010),bVar6,uVar3,uVar7,*(void **)(this + 0x8820));
    uVar7 = *(ulong *)(this + 0x8810);
    if ((uVar7 & 0x1f) != 0) {
      uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar7 & 0x1f);
      uVar7 = (uVar7 - uVar3) + 0x20;
    }
    *(ulong *)(this + 0x8818) = *(long *)(this + 0x8818) + (bVar6 * uVar7 >> 3) + 0x10;
  }
  uVar7 = 1;
LAB_0107c0b2:
  return SUB81(uVar7,0);
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}